

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler *
llama_sampler_init_mirostat(int32_t n_vocab,uint32_t seed,float tau,float eta,int32_t m)

{
  uint32_t uVar1;
  int32_t *ctx;
  llama_sampler *plVar2;
  
  uVar1 = get_rng_seed(seed);
  ctx = (int32_t *)operator_new(0x13a8);
  *ctx = n_vocab;
  ctx[1] = seed;
  ctx[2] = uVar1;
  ctx[3] = (int32_t)tau;
  ctx[4] = (int32_t)eta;
  ctx[5] = m;
  ctx[6] = (int32_t)(tau + tau);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)(ctx + 8),(ulong)uVar1);
  plVar2 = llama_sampler_init(&llama_sampler_mirostat_i,ctx);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_mirostat(int32_t n_vocab, uint32_t seed, float tau, float eta, int32_t m) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_mirostat_i,
        /* .ctx   = */ new llama_sampler_mirostat {
            /* .n_vocab  = */ n_vocab,
            /* .seed     = */ seed,
            /* .seed_cur = */ seed_cur,
            /* .tau      = */ tau,
            /* .eta      = */ eta,
            /* .m        = */ m,
            /* .mu       = */ 2.0f*tau,
            /* .rng      = */ std::mt19937(seed_cur),
        }
    );
}